

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_res.cpp
# Opt level: O3

CollationCacheEntry * __thiscall
icu_63::CollationLoader::createCacheEntry(CollationLoader *this,UErrorCode *errorCode)

{
  uint uVar1;
  UBool UVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  CollationCacheEntry *pCVar6;
  Locale *other;
  UResourceBundle *pUVar7;
  UChar *us;
  LocalPointerBase<UResourceBundle> resourceBundle;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  char *pcVar11;
  Locale *pLVar12;
  undefined1 auStack_1d8 [184];
  LocalUResourceBundlePointer LStack_120;
  int iStack_114;
  Locale LStack_110;
  
  if (this->bundle == (UResourceBundle *)0x0) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pLVar12 = &this->locale;
      pcVar11 = Locale::getBaseName(pLVar12);
      pUVar7 = ures_openNoDefault_63("icudt63l-coll",pcVar11,errorCode);
      this->bundle = pUVar7;
      if (*errorCode == U_MISSING_RESOURCE_ERROR) {
        *errorCode = U_USING_DEFAULT_WARNING;
        SharedObject::addRef(&this->rootEntry->super_SharedObject);
        pCVar6 = this->rootEntry;
      }
      else {
        Locale::Locale((Locale *)(LStack_110.script + 4),pLVar12);
        pcVar11 = ures_getLocaleByType_63(this->bundle,ULOC_ACTUAL_LOCALE,errorCode);
        if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
          Locale::Locale((Locale *)auStack_1d8,pcVar11,(char *)0x0,(char *)0x0,(char *)0x0);
          other = Locale::operator=(&this->validLocale,(Locale *)auStack_1d8);
          Locale::operator=(pLVar12,other);
          Locale::~Locale((Locale *)auStack_1d8);
          if (this->type[0] != '\0') {
            Locale::setKeywordValue(pLVar12,"collation",this->type,errorCode);
          }
          UVar2 = Locale::operator==(pLVar12,(Locale *)(LStack_110.script + 4));
          if (UVar2 == '\0') {
            pCVar6 = getCacheEntry(this,errorCode);
          }
          else {
            pCVar6 = loadFromBundle(this,errorCode);
          }
        }
        else {
          pCVar6 = (CollationCacheEntry *)0x0;
        }
        Locale::~Locale((Locale *)(LStack_110.script + 4));
      }
    }
    else {
      pCVar6 = (CollationCacheEntry *)0x0;
    }
    return pCVar6;
  }
  if (this->collations == (UResourceBundle *)0x0) {
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pcVar11 = "collations";
      LStack_110.baseName = (char *)0x225150;
      pUVar7 = ures_getByKey_63(this->bundle,"collations",(UResourceBundle *)0x0,errorCode);
      this->collations = pUVar7;
      if (*errorCode == U_MISSING_RESOURCE_ERROR) {
        *errorCode = U_USING_DEFAULT_WARNING;
        pCVar6 = makeCacheEntryFromRoot(this,(Locale *)pcVar11,errorCode);
        return pCVar6;
      }
      if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
        LStack_110._220_4_ = 0;
        LStack_110.baseName = (char *)0x2251a0;
        pUVar7 = ures_getByKeyWithFallback_63
                           (pUVar7,"default",(UResourceBundle *)0x0,
                            (UErrorCode *)&LStack_110.field_0xdc);
        LStack_110.baseName = (char *)0x2251b3;
        us = ures_getString_63(pUVar7,(int32_t *)&LStack_110.fIsBogus,
                               (UErrorCode *)&LStack_110.field_0xdc);
        pcVar11 = this->defaultType;
        if (LStack_110._216_4_ - 1 < 0xf && (int)LStack_110._220_4_ < 1) {
          LStack_110.baseName = (char *)0x2251ef;
          u_UCharsToChars_63(us,pcVar11,LStack_110._216_4_ + 1);
        }
        else {
          builtin_strncpy(pcVar11,"standard",9);
        }
        LStack_110.baseName = (char *)0x225205;
        LocalUResourceBundlePointer::~LocalUResourceBundlePointer
                  ((LocalUResourceBundlePointer *)&stack0xffffffffffffffd0);
        pcVar9 = this->type;
        if (this->type[0] != '\0') {
          LStack_110.baseName = (char *)0x225221;
          iVar4 = strcmp(pcVar9,pcVar11);
          if (iVar4 == 0) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 2;
          }
          if (*(int *)(this->type + 3) == 0x686372 && *(int *)pcVar9 == 0x72616573) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 1;
          }
          if (this->type[8] == '\0' && *(long *)pcVar9 == 0x647261646e617473) {
            *(byte *)&this->typesTried = (byte)this->typesTried | 4;
          }
          LStack_110.baseName = (char *)0x22526a;
          pCVar6 = loadFromCollations(this,errorCode);
          return pCVar6;
        }
        LStack_110.baseName = (char *)0x22527a;
        strcpy(pcVar9,pcVar11);
        uVar1 = this->typesTried;
        uVar3 = uVar1 | 2;
        this->typesTried = uVar3;
        if (*(int *)(this->type + 3) == 0x686372 && *(int *)this->type == 0x72616573) {
          uVar3 = uVar1 | 3;
          this->typesTried = uVar3;
        }
        if (this->type[8] == '\0' && *(long *)pcVar9 == 0x647261646e617473) {
          this->typesTried = uVar3 | 4;
        }
        LStack_110.baseName = (char *)0x2252e5;
        Locale::setKeywordValue(&this->locale,"collation",pcVar9,errorCode);
        LStack_110.baseName = (char *)0x2252f0;
        pCVar6 = getCacheEntry(this,errorCode);
        return pCVar6;
      }
    }
    return (CollationCacheEntry *)0x0;
  }
  if (this->data != (UResourceBundle *)0x0) {
    pCVar6 = loadFromData(this,errorCode);
    return pCVar6;
  }
  if (U_ZERO_ERROR < *errorCode) {
    return (CollationCacheEntry *)0x0;
  }
  pcVar11 = this->type;
  auStack_1d8[0xa8] = 'H';
  auStack_1d8[0xa9] = 'S';
  auStack_1d8[0xaa] = '\"';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  pLVar12 = (Locale *)pcVar11;
  resourceBundle.ptr =
       ures_getByKeyWithFallback_63(this->collations,pcVar11,(UResourceBundle *)0x0,errorCode);
  LStack_120.super_LocalPointerBase<UResourceBundle>.ptr =
       (LocalPointerBase<UResourceBundle>)(LocalPointerBase<UResourceBundle>)resourceBundle.ptr;
  if (*errorCode == U_MISSING_RESOURCE_ERROR) {
    auStack_1d8[0xa8] = '\\';
    auStack_1d8[0xa9] = 'S';
    auStack_1d8[0xaa] = '\"';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    sVar8 = strlen(pcVar11);
    *errorCode = U_USING_DEFAULT_WARNING;
    this->typeFallback = '\x01';
    uVar1 = this->typesTried;
    if ((((uVar1 & 1) == 0) && (6 < (int)sVar8)) &&
       (*(short *)(this->type + 4) == 0x6863 && *(int *)pcVar11 == 0x72616573)) {
      this->typesTried = uVar1 | 1;
      this->type[6] = '\0';
    }
    else if ((uVar1 & 2) == 0) {
      this->typesTried = uVar1 | 2;
      auStack_1d8[0xa8] = -0x50;
      auStack_1d8[0xa9] = 'S';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      strcpy(pcVar11,this->defaultType);
    }
    else {
      if ((uVar1 & 4) != 0) {
        auStack_1d8[0xa8] = '\x0e';
        auStack_1d8[0xa9] = 'T';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar6 = makeCacheEntryFromRoot(this,pLVar12,errorCode);
        goto LAB_00225449;
      }
      this->typesTried = uVar1 | 4;
      builtin_strncpy(pcVar11,"standard",9);
    }
    auStack_1d8[0xa8] = ';';
    auStack_1d8[0xa9] = 'T';
    auStack_1d8[0xaa] = '\"';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    Locale::setKeywordValue(&this->locale,"collation",pcVar11,errorCode);
    auStack_1d8[0xa8] = 'F';
    auStack_1d8[0xa9] = 'T';
    auStack_1d8[0xaa] = '\"';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    pCVar6 = getCacheEntry(this,errorCode);
    goto LAB_00225449;
  }
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    LStack_120.super_LocalPointerBase<UResourceBundle>.ptr =
         (LocalPointerBase<UResourceBundle>)(UResourceBundle *)0x0;
    this->data = resourceBundle.ptr;
    auStack_1d8[0xa8] = -0x2d;
    auStack_1d8[0xa9] = 'S';
    auStack_1d8[0xaa] = '\"';
    auStack_1d8[0xab] = '\0';
    auStack_1d8[0xac] = '\0';
    auStack_1d8[0xad] = '\0';
    auStack_1d8[0xae] = '\0';
    auStack_1d8[0xaf] = '\0';
    pcVar9 = ures_getLocaleByType_63(resourceBundle.ptr,ULOC_ACTUAL_LOCALE,errorCode);
    if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
      pLVar12 = &this->validLocale;
      auStack_1d8[0xa8] = 'w';
      auStack_1d8[0xa9] = 'T';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      pcVar10 = Locale::getBaseName(pLVar12);
      auStack_1d8[0xa8] = -0x7e;
      auStack_1d8[0xa9] = 'T';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      iVar4 = strcmp(pcVar9,pcVar10);
      pcVar10 = this->defaultType;
      auStack_1d8[0xa8] = -0x6d;
      auStack_1d8[0xa9] = 'T';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      iVar5 = strcmp(pcVar11,pcVar10);
      if (iVar5 != 0) {
        pcVar10 = "collation";
        auStack_1d8[0xa8] = -0x54;
        auStack_1d8[0xa9] = 'T';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        Locale::setKeywordValue(pLVar12,"collation",pcVar11,errorCode);
        if (U_ZERO_ERROR < *errorCode) goto LAB_002253dc;
      }
      if (*pcVar9 == '\0') {
LAB_002254cf:
        if (this->type[8] == '\0' && *(long *)pcVar11 == 0x647261646e617473) {
          if (this->typeFallback != '\0') {
            *errorCode = U_USING_DEFAULT_WARNING;
          }
          auStack_1d8[0xa8] = -0x7a;
          auStack_1d8[0xa9] = 'U';
          auStack_1d8[0xaa] = '\"';
          auStack_1d8[0xab] = '\0';
          auStack_1d8[0xac] = '\0';
          auStack_1d8[0xad] = '\0';
          auStack_1d8[0xae] = '\0';
          auStack_1d8[0xaf] = '\0';
          pCVar6 = makeCacheEntryFromRoot(this,(Locale *)pcVar10,errorCode);
          goto LAB_00225449;
        }
      }
      else {
        pcVar10 = "root";
        auStack_1d8[0xa8] = -0x35;
        auStack_1d8[0xa9] = 'T';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        iVar5 = strcmp(pcVar9,"root");
        if (iVar5 == 0) goto LAB_002254cf;
      }
      auStack_1d8[0xa8] = '\x02';
      auStack_1d8[0xa9] = 'U';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      iStack_114 = iVar4;
      Locale::Locale(&LStack_110,pcVar9,(char *)0x0,(char *)0x0,(char *)0x0);
      auStack_1d8[0xa8] = '\x19';
      auStack_1d8[0xa9] = 'U';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      Locale::operator=(&this->locale,&LStack_110);
      auStack_1d8[0xa8] = '!';
      auStack_1d8[0xa9] = 'U';
      auStack_1d8[0xaa] = '\"';
      auStack_1d8[0xab] = '\0';
      auStack_1d8[0xac] = '\0';
      auStack_1d8[0xad] = '\0';
      auStack_1d8[0xae] = '\0';
      auStack_1d8[0xaf] = '\0';
      Locale::~Locale(&LStack_110);
      if (iStack_114 == 0) {
        auStack_1d8[0xa8] = 'f';
        auStack_1d8[0xa9] = 'U';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar6 = loadFromData(this,errorCode);
      }
      else {
        auStack_1d8[0xa8] = '=';
        auStack_1d8[0xa9] = 'U';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        Locale::setKeywordValue(&this->locale,"collation",pcVar11,errorCode);
        auStack_1d8[0xa8] = 'H';
        auStack_1d8[0xa9] = 'U';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar6 = getCacheEntry(this,errorCode);
        auStack_1d8[0xa8] = 'V';
        auStack_1d8[0xa9] = 'U';
        auStack_1d8[0xaa] = '\"';
        auStack_1d8[0xab] = '\0';
        auStack_1d8[0xac] = '\0';
        auStack_1d8[0xad] = '\0';
        auStack_1d8[0xae] = '\0';
        auStack_1d8[0xaf] = '\0';
        pCVar6 = makeCacheEntry(pLVar12,pCVar6,errorCode);
      }
      goto LAB_00225449;
    }
  }
LAB_002253dc:
  pCVar6 = (CollationCacheEntry *)0x0;
LAB_00225449:
  auStack_1d8[0xa8] = 'S';
  auStack_1d8[0xa9] = 'T';
  auStack_1d8[0xaa] = '\"';
  auStack_1d8[0xab] = '\0';
  auStack_1d8[0xac] = '\0';
  auStack_1d8[0xad] = '\0';
  auStack_1d8[0xae] = '\0';
  auStack_1d8[0xaf] = '\0';
  LocalUResourceBundlePointer::~LocalUResourceBundlePointer(&LStack_120);
  return pCVar6;
}

Assistant:

const CollationCacheEntry *
CollationLoader::createCacheEntry(UErrorCode &errorCode) {
    // This is a linear lookup and fallback flow turned into a state machine.
    // Most local variables have been turned into instance fields.
    // In a cache miss, cache.get() calls CacheKey::createObject(),
    // which means that we progress via recursion.
    // loadFromCollations() will recurse to itself as well for collation type fallback.
    if(bundle == NULL) {
        return loadFromLocale(errorCode);
    } else if(collations == NULL) {
        return loadFromBundle(errorCode);
    } else if(data == NULL) {
        return loadFromCollations(errorCode);
    } else {
        return loadFromData(errorCode);
    }
}